

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265d_com.c
# Opt level: O0

void hal_record_scaling_list(scalingFactor_t *pScalingFactor_out,scalingList_t *pScalingList)

{
  RK_U8 *pRVar1;
  int iVar2;
  uint uVar3;
  RK_U8 local_a8 [8];
  RK_U8 temp16 [16];
  RK_U8 tmpBuf [64];
  RK_U8 *p;
  RK_U32 listId;
  RK_U32 matrixId;
  RK_U32 sizeId;
  RK_U32 nIndex;
  RK_U32 g_scalingListNum_model [4];
  int local_1c;
  RK_S32 i;
  scalingList_t *pScalingList_local;
  scalingFactor_t *pScalingFactor_out_local;
  
  _sizeId = 0x600000006;
  g_scalingListNum_model[0] = 6;
  g_scalingListNum_model[1] = 2;
  matrixId = 0;
  for (listId = 0; listId < 4; listId = listId + 1) {
    for (p._0_4_ = 0; (uint)p < (&sizeId)[listId]; p._0_4_ = (uint)p + 1) {
      if (listId < 3) {
        local_1c = 0;
        while( true ) {
          iVar2 = 0x40;
          if (listId == 0) {
            iVar2 = 0x10;
          }
          if (iVar2 <= local_1c) break;
          pScalingFactor_out->scalingfactor0[matrixId] = pScalingList->sl[listId][(uint)p][local_1c]
          ;
          local_1c = local_1c + 1;
          matrixId = matrixId + 1;
        }
      }
      else {
        for (local_1c = 0; local_1c < 0x40; local_1c = local_1c + 1) {
          pScalingFactor_out->scalingfactor0[matrixId] = pScalingList->sl[listId][(uint)p][local_1c]
          ;
          matrixId = matrixId + 1;
        }
        for (local_1c = 0; local_1c < 0x80; local_1c = local_1c + 1) {
          pScalingFactor_out->scalingfactor0[matrixId] = '\0';
          matrixId = matrixId + 1;
        }
      }
    }
  }
  matrixId = 0;
  for (p._0_4_ = 0; (uint)p < sizeId; p._0_4_ = (uint)p + 1) {
    memset(local_a8,0,0x10);
    for (local_1c = 0; local_1c < 0x10; local_1c = local_1c + 1) {
      local_a8[local_1c] = pScalingList->sl[0][(uint)p][local_1c];
    }
    for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
      pScalingFactor_out->scalingfactor1[matrixId] = local_a8[local_1c];
      pScalingFactor_out->scalingfactor1[matrixId + 1] = local_a8[local_1c + 4];
      uVar3 = matrixId + 3;
      pScalingFactor_out->scalingfactor1[matrixId + 2] = local_a8[local_1c + 8];
      matrixId = matrixId + 4;
      pScalingFactor_out->scalingfactor1[uVar3] = local_a8[local_1c + 0xc];
    }
  }
  matrixId = 0;
  for (p._0_4_ = 0; (uint)p < g_scalingListNum_model[0]; p._0_4_ = (uint)p + 1) {
    pScalingFactor_out->scalingdc[matrixId] = pScalingList->sl_dc[0][(uint)p];
    matrixId = matrixId + 1;
  }
  for (p._0_4_ = 0; (uint)p < g_scalingListNum_model[1]; p._0_4_ = (uint)p + 1) {
    pScalingFactor_out->scalingdc[matrixId] = pScalingList->sl_dc[1][(uint)p];
    uVar3 = matrixId + 2;
    pScalingFactor_out->scalingdc[matrixId + 1] = '\0';
    matrixId = matrixId + 3;
    pScalingFactor_out->scalingdc[uVar3] = '\0';
  }
  matrixId = 0;
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    pScalingFactor_out->reserverd[matrixId] = '\0';
    matrixId = matrixId + 1;
  }
  for (p._4_4_ = 0; p._4_4_ < 6; p._4_4_ = p._4_4_ + 1) {
    pRVar1 = pScalingFactor_out->scalingfactor0 + (p._4_4_ << 4);
    for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
      temp16[(long)local_1c + 8] = pRVar1[local_1c << 2];
      temp16[(long)(local_1c + 4) + 8] = pRVar1[local_1c * 4 + 1];
      temp16[(long)(local_1c + 8) + 8] = pRVar1[local_1c * 4 + 2];
      temp16[(long)(local_1c + 0xc) + 8] = pRVar1[local_1c * 4 + 3];
    }
    *(undefined8 *)pRVar1 = temp16._8_8_;
    *(undefined8 *)(pRVar1 + 8) = tmpBuf._0_8_;
  }
  for (p._4_4_ = 0; p._4_4_ < 6; p._4_4_ = p._4_4_ + 1) {
    pRVar1 = pScalingFactor_out->scalingfactor0 + (ulong)(p._4_4_ << 6) + 0x60;
    for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
      temp16[(long)local_1c + 8] = pRVar1[local_1c << 3];
      temp16[(long)(local_1c + 8) + 8] = pRVar1[local_1c * 8 + 1];
      temp16[(long)(local_1c + 0x10) + 8] = pRVar1[local_1c * 8 + 2];
      temp16[(long)(local_1c + 0x18) + 8] = pRVar1[local_1c * 8 + 3];
      temp16[(long)(local_1c + 0x20) + 8] = pRVar1[local_1c * 8 + 4];
      temp16[(long)(local_1c + 0x28) + 8] = pRVar1[local_1c * 8 + 5];
      temp16[(long)(local_1c + 0x30) + 8] = pRVar1[local_1c * 8 + 6];
      temp16[(long)(local_1c + 0x38) + 8] = pRVar1[local_1c * 8 + 7];
    }
    memcpy(pRVar1,temp16 + 8,0x40);
  }
  for (p._4_4_ = 0; p._4_4_ < 6; p._4_4_ = p._4_4_ + 1) {
    pRVar1 = pScalingFactor_out->scalingfactor0 + (ulong)(p._4_4_ << 6) + 0x1e0;
    for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
      temp16[(long)local_1c + 8] = pRVar1[local_1c << 3];
      temp16[(long)(local_1c + 8) + 8] = pRVar1[local_1c * 8 + 1];
      temp16[(long)(local_1c + 0x10) + 8] = pRVar1[local_1c * 8 + 2];
      temp16[(long)(local_1c + 0x18) + 8] = pRVar1[local_1c * 8 + 3];
      temp16[(long)(local_1c + 0x20) + 8] = pRVar1[local_1c * 8 + 4];
      temp16[(long)(local_1c + 0x28) + 8] = pRVar1[local_1c * 8 + 5];
      temp16[(long)(local_1c + 0x30) + 8] = pRVar1[local_1c * 8 + 6];
      temp16[(long)(local_1c + 0x38) + 8] = pRVar1[local_1c * 8 + 7];
    }
    memcpy(pRVar1,temp16 + 8,0x40);
  }
  for (p._4_4_ = 0; p._4_4_ < 6; p._4_4_ = p._4_4_ + 1) {
    pRVar1 = pScalingFactor_out->scalingfactor0 + (ulong)(p._4_4_ << 6) + 0x360;
    for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
      temp16[(long)local_1c + 8] = pRVar1[local_1c << 3];
      temp16[(long)(local_1c + 8) + 8] = pRVar1[local_1c * 8 + 1];
      temp16[(long)(local_1c + 0x10) + 8] = pRVar1[local_1c * 8 + 2];
      temp16[(long)(local_1c + 0x18) + 8] = pRVar1[local_1c * 8 + 3];
      temp16[(long)(local_1c + 0x20) + 8] = pRVar1[local_1c * 8 + 4];
      temp16[(long)(local_1c + 0x28) + 8] = pRVar1[local_1c * 8 + 5];
      temp16[(long)(local_1c + 0x30) + 8] = pRVar1[local_1c * 8 + 6];
      temp16[(long)(local_1c + 0x38) + 8] = pRVar1[local_1c * 8 + 7];
    }
    memcpy(pRVar1,temp16 + 8,0x40);
  }
  for (p._4_4_ = 0; p._4_4_ < 6; p._4_4_ = p._4_4_ + 1) {
    pRVar1 = pScalingFactor_out->scalingfactor1 + (p._4_4_ << 4);
    for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
      temp16[(long)local_1c + 8] = pRVar1[local_1c << 2];
      temp16[(long)(local_1c + 4) + 8] = pRVar1[local_1c * 4 + 1];
      temp16[(long)(local_1c + 8) + 8] = pRVar1[local_1c * 4 + 2];
      temp16[(long)(local_1c + 0xc) + 8] = pRVar1[local_1c * 4 + 3];
    }
    *(undefined8 *)pRVar1 = temp16._8_8_;
    *(undefined8 *)(pRVar1 + 8) = tmpBuf._0_8_;
  }
  return;
}

Assistant:

void hal_record_scaling_list(scalingFactor_t *pScalingFactor_out, scalingList_t *pScalingList)
{
    RK_S32 i;
    RK_U32 g_scalingListNum_model[SCALING_LIST_SIZE_NUM] = {6, 6, 6, 2}; // from C Model
    RK_U32 nIndex = 0;
    RK_U32 sizeId, matrixId, listId;
    RK_U8 *p = pScalingFactor_out->scalingfactor0;
    RK_U8 tmpBuf[8 * 8];

    //output non-default scalingFactor Table (1248 BYTES)
    for (sizeId = 0; sizeId < SCALING_LIST_SIZE_NUM; sizeId++) {
        for (listId = 0; listId < g_scalingListNum_model[sizeId]; listId++) {
            if (sizeId < 3) {
                for (i = 0; i < (sizeId == 0 ? 16 : 64); i++) {
                    pScalingFactor_out->scalingfactor0[nIndex++] = (RK_U8)pScalingList->sl[sizeId][listId][i];
                }
            } else {
                for (i = 0; i < 64; i ++) {
                    pScalingFactor_out->scalingfactor0[nIndex++] = (RK_U8)pScalingList->sl[sizeId][listId][i];
                }
                for (i = 0; i < 128; i ++) {
                    pScalingFactor_out->scalingfactor0[nIndex++] = 0;
                }
            }
        }
    }
    //output non-default scalingFactor Table Rotation(96 Bytes)
    nIndex = 0;
    for (listId = 0; listId < g_scalingListNum_model[0]; listId++) {
        RK_U8 temp16[16] = {0};
        for (i = 0; i < 16; i ++) {
            temp16[i] = (RK_U8)pScalingList->sl[0][listId][i];
        }
        for (i = 0; i < 4; i ++) {
            pScalingFactor_out->scalingfactor1[nIndex++] = temp16[i];
            pScalingFactor_out->scalingfactor1[nIndex++] = temp16[i + 4];
            pScalingFactor_out->scalingfactor1[nIndex++] = temp16[i + 8];
            pScalingFactor_out->scalingfactor1[nIndex++] = temp16[i + 12];
        }
    }
    //output non-default ScalingList_DC_Coeff (12 BYTES)
    nIndex = 0;
    for (listId = 0; listId < g_scalingListNum_model[2]; listId++) { //sizeId = 2
        pScalingFactor_out->scalingdc[nIndex++] = (RK_U8)pScalingList->sl_dc[0][listId];// zrh warning: sl_dc differed from scalingList->getScalingListDC
    }
    for (listId = 0; listId < g_scalingListNum_model[3]; listId++) { //sizeId = 3
        pScalingFactor_out->scalingdc[nIndex++] = (RK_U8)pScalingList->sl_dc[1][listId];// zrh warning: sl_dc differed from scalingList->getScalingListDC
        pScalingFactor_out->scalingdc[nIndex++] = 0;
        pScalingFactor_out->scalingdc[nIndex++] = 0;
    }

    //align 16X address
    nIndex = 0;
    for (i = 0; i < 4; i ++) {
        pScalingFactor_out->reserverd[nIndex++] = 0;
    }

    //----------------------All above code show the normal store way in HM--------------------------
    //--------from now on, the scalingfactor0 is rotated 90', the scalingfactor1 is also rotated 90'

    //sizeId == 0
    for (matrixId = 0; matrixId < 6; matrixId++) {
        p = pScalingFactor_out->scalingfactor0 + matrixId * 16;

        for (i = 0; i < 4; i++) {
            tmpBuf[4 * 0 + i] = p[i * 4 + 0];
            tmpBuf[4 * 1 + i] = p[i * 4 + 1];
            tmpBuf[4 * 2 + i] = p[i * 4 + 2];
            tmpBuf[4 * 3 + i] = p[i * 4 + 3];
        }
        memcpy(p, tmpBuf, 4 * 4 * sizeof(RK_U8));
    }
    //sizeId == 1
    for (matrixId = 0; matrixId < 6; matrixId++) {
        p = pScalingFactor_out->scalingfactor0 + 6 * 16 + matrixId * 64;

        for (i = 0; i < 8; i++) {
            tmpBuf[8 * 0 + i] = p[i * 8 + 0];
            tmpBuf[8 * 1 + i] = p[i * 8 + 1];
            tmpBuf[8 * 2 + i] = p[i * 8 + 2];
            tmpBuf[8 * 3 + i] = p[i * 8 + 3];
            tmpBuf[8 * 4 + i] = p[i * 8 + 4];
            tmpBuf[8 * 5 + i] = p[i * 8 + 5];
            tmpBuf[8 * 6 + i] = p[i * 8 + 6];
            tmpBuf[8 * 7 + i] = p[i * 8 + 7];
        }
        memcpy(p, tmpBuf, 8 * 8 * sizeof(RK_U8));
    }
    //sizeId == 2
    for (matrixId = 0; matrixId < 6; matrixId++) {
        p = pScalingFactor_out->scalingfactor0 + 6 * 16 + 6 * 64 + matrixId * 64;

        for (i = 0; i < 8; i++) {
            tmpBuf[8 * 0 + i] = p[i * 8 + 0];
            tmpBuf[8 * 1 + i] = p[i * 8 + 1];
            tmpBuf[8 * 2 + i] = p[i * 8 + 2];
            tmpBuf[8 * 3 + i] = p[i * 8 + 3];
            tmpBuf[8 * 4 + i] = p[i * 8 + 4];
            tmpBuf[8 * 5 + i] = p[i * 8 + 5];
            tmpBuf[8 * 6 + i] = p[i * 8 + 6];
            tmpBuf[8 * 7 + i] = p[i * 8 + 7];
        }
        memcpy(p, tmpBuf, 8 * 8 * sizeof(RK_U8));
    }
    //sizeId == 3
    for (matrixId = 0; matrixId < 6; matrixId++) {
        p = pScalingFactor_out->scalingfactor0 + 6 * 16 + 6 * 64 + 6 * 64 + matrixId * 64;

        for (i = 0; i < 8; i++) {
            tmpBuf[8 * 0 + i] = p[i * 8 + 0];
            tmpBuf[8 * 1 + i] = p[i * 8 + 1];
            tmpBuf[8 * 2 + i] = p[i * 8 + 2];
            tmpBuf[8 * 3 + i] = p[i * 8 + 3];
            tmpBuf[8 * 4 + i] = p[i * 8 + 4];
            tmpBuf[8 * 5 + i] = p[i * 8 + 5];
            tmpBuf[8 * 6 + i] = p[i * 8 + 6];
            tmpBuf[8 * 7 + i] = p[i * 8 + 7];
        }
        memcpy(p, tmpBuf, 8 * 8 * sizeof(RK_U8));
    }

    //sizeId == 0
    for (matrixId = 0; matrixId < 6; matrixId++) {
        p = pScalingFactor_out->scalingfactor1 + matrixId * 16;

        for (i = 0; i < 4; i++) {
            tmpBuf[4 * 0 + i] = p[i * 4 + 0];
            tmpBuf[4 * 1 + i] = p[i * 4 + 1];
            tmpBuf[4 * 2 + i] = p[i * 4 + 2];
            tmpBuf[4 * 3 + i] = p[i * 4 + 3];
        }
        memcpy(p, tmpBuf, 4 * 4 * sizeof(RK_U8));
    }
}